

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void free_exts(void)

{
  char **__ptr;
  int index;
  long lVar1;
  
  __ptr = exts_i;
  if (exts_i != (char **)0x0) {
    for (lVar1 = 0; lVar1 < num_exts_i; lVar1 = lVar1 + 1) {
      free(__ptr[lVar1]);
    }
    free(__ptr);
    exts_i = (char **)0x0;
  }
  return;
}

Assistant:

static void free_exts(void) {
    if (exts_i != NULL) {
        int index;
        for(index = 0; index < num_exts_i; index++) {
            free((char *)exts_i[index]);
        }
        free((void *)exts_i);
        exts_i = NULL;
    }
}